

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O1

void __thiscall cmCursesMainForm::~cmCursesMainForm(cmCursesMainForm *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FORM *form;
  vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *pvVar2;
  pointer ppcVar3;
  cmake *this_00;
  pointer pcVar4;
  
  (this->super_cmCursesForm)._vptr_cmCursesForm = (_func_int **)&PTR__cmCursesMainForm_005c4c50;
  form = (this->super_cmCursesForm).Form;
  if (form != (FORM *)0x0) {
    unpost_form(form);
    free_form((this->super_cmCursesForm).Form);
    (this->super_cmCursesForm).Form = (FORM *)0x0;
  }
  if (this->Fields != (FIELD **)0x0) {
    operator_delete__(this->Fields);
  }
  pvVar2 = this->Entries;
  if (pvVar2 != (vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                 *)0x0) {
    std::
    for_each<__gnu_cxx::__normal_iterator<cmCursesCacheEntryComposite*const*,std::vector<cmCursesCacheEntryComposite*,std::allocator<cmCursesCacheEntryComposite*>>>,ContainerAlgorithms::DefaultDeleter<std::vector<cmCursesCacheEntryComposite*,std::allocator<cmCursesCacheEntryComposite*>>,false>>
              ((pvVar2->
               super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
               )._M_impl.super__Vector_impl_data._M_start,
               (pvVar2->
               super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
               )._M_impl.super__Vector_impl_data._M_finish);
  }
  pvVar2 = this->Entries;
  if (pvVar2 != (vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                 *)0x0) {
    ppcVar3 = (pvVar2->
              super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (ppcVar3 != (pointer)0x0) {
      operator_delete(ppcVar3,(long)(pvVar2->
                                    super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                                    )._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppcVar3);
    }
    operator_delete(pvVar2,0x18);
  }
  this_00 = this->CMakeInstance;
  if (this_00 != (cmake *)0x0) {
    cmake::~cmake(this_00);
    operator_delete(this_00,0x2b0);
    this->CMakeInstance = (cmake *)0x0;
  }
  pcVar4 = (this->OldSearchString)._M_dataplus._M_p;
  paVar1 = &(this->OldSearchString).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->SearchString)._M_dataplus._M_p;
  paVar1 = &(this->SearchString).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->WhereCMake)._M_dataplus._M_p;
  paVar1 = &(this->WhereCMake).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->WhereSource)._M_dataplus._M_p;
  paVar1 = &(this->WhereSource).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->HelpMessage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Args);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Errors);
  cmCursesForm::~cmCursesForm(&this->super_cmCursesForm);
  return;
}

Assistant:

cmCursesMainForm::~cmCursesMainForm()
{
  if (this->Form)
    {
    unpost_form(this->Form);
    free_form(this->Form);
    this->Form = 0;
    }
  delete[] this->Fields;

  // Clean-up composites
  if (this->Entries)
    {
    cmDeleteAll(*this->Entries);
    }
  delete this->Entries;
  if (this->CMakeInstance)
    {
    delete this->CMakeInstance;
    this->CMakeInstance = 0;
    }
}